

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O0

optional<wasm::WATParser::(anonymous_namespace)::LexIntResult> *
wasm::WATParser::anon_unknown_0::integer
          (optional<wasm::WATParser::(anonymous_namespace)::LexIntResult> *__return_storage_ptr__,
          string_view in)

{
  bool bVar1;
  LexIntResult *pLVar2;
  OverflowBehavior in_R8D;
  string_view in_00;
  string_view sVar3;
  anon_unknown_0 *local_d0;
  char *local_c8;
  undefined1 local_c0 [8];
  optional<wasm::WATParser::(anonymous_namespace)::LexIntResult> lexed_1;
  char *local_90;
  undefined1 local_88 [8];
  optional<wasm::WATParser::(anonymous_namespace)::LexIntResult> lexed;
  undefined1 local_40 [8];
  LexIntCtx ctx;
  string_view in_local;
  
  ctx._32_8_ = in._M_len;
  LexIntCtx::LexIntCtx((LexIntCtx *)local_40,in);
  LexIntCtx::takeSign((LexIntCtx *)local_40);
  join_0x00000010_0x00000000_ = sv("0x",2);
  bVar1 = LexCtx::takePrefix((LexCtx *)local_40,join_0x00000010_0x00000000_);
  if (bVar1) {
    join_0x00000010_0x00000000_ = LexCtx::next((LexCtx *)local_40);
    sVar3._M_str = (char *)0x0;
    sVar3._M_len = (size_t)local_90;
    hexnum((optional<wasm::WATParser::(anonymous_namespace)::LexIntResult> *)local_88,
           (anon_unknown_0 *)
           lexed_1.
           super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>.
           _M_payload.
           super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>._32_8_
           ,sVar3,in_R8D);
    bVar1 = std::optional::operator_cast_to_bool((optional *)local_88);
    if (bVar1) {
      pLVar2 = std::optional<wasm::WATParser::(anonymous_namespace)::LexIntResult>::operator*
                         ((optional<wasm::WATParser::(anonymous_namespace)::LexIntResult> *)local_88
                         );
      LexIntCtx::take((LexIntCtx *)local_40,pLVar2);
      bVar1 = LexCtx::canFinish((LexCtx *)local_40);
      if (bVar1) {
        LexIntCtx::lexed(__return_storage_ptr__,(LexIntCtx *)local_40);
        return __return_storage_ptr__;
      }
    }
    std::optional<wasm::WATParser::(anonymous_namespace)::LexIntResult>::optional
              (__return_storage_ptr__);
  }
  else {
    sVar3 = LexCtx::next((LexCtx *)local_40);
    local_d0 = (anon_unknown_0 *)sVar3._M_len;
    local_c8 = sVar3._M_str;
    in_00._M_str = (char *)0x0;
    in_00._M_len = (size_t)local_c8;
    num((optional<wasm::WATParser::(anonymous_namespace)::LexIntResult> *)local_c0,local_d0,in_00,
        in_R8D);
    bVar1 = std::optional::operator_cast_to_bool((optional *)local_c0);
    if (bVar1) {
      pLVar2 = std::optional<wasm::WATParser::(anonymous_namespace)::LexIntResult>::operator*
                         ((optional<wasm::WATParser::(anonymous_namespace)::LexIntResult> *)local_c0
                         );
      LexIntCtx::take((LexIntCtx *)local_40,pLVar2);
      bVar1 = LexCtx::canFinish((LexCtx *)local_40);
      if (bVar1) {
        LexIntCtx::lexed(__return_storage_ptr__,(LexIntCtx *)local_40);
        return __return_storage_ptr__;
      }
    }
    std::optional<wasm::WATParser::(anonymous_namespace)::LexIntResult>::optional
              (__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::optional<LexIntResult> integer(std::string_view in) {
  LexIntCtx ctx(in);
  ctx.takeSign();
  if (ctx.takePrefix("0x"sv)) {
    if (auto lexed = hexnum(ctx.next())) {
      ctx.take(*lexed);
      if (ctx.canFinish()) {
        return ctx.lexed();
      }
    }
    // TODO: Add error production for unrecognized hexnum.
    return {};
  }
  if (auto lexed = num(ctx.next())) {
    ctx.take(*lexed);
    if (ctx.canFinish()) {
      return ctx.lexed();
    }
  }
  return {};
}